

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O1

int __thiscall
capnp::_::anon_unknown_0::TestVat::ConnectionImpl::shutdown(ConnectionImpl *this,int __fd,int __how)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  _func_int **pp_Var3;
  void *pvVar4;
  undefined4 in_register_00000034;
  PromiseArena *pPVar5;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode local_1d0;
  OwnPromiseNode local_1c8;
  _func_int **local_1c0;
  Exception local_1b8;
  
  pPVar5 = (PromiseArena *)CONCAT44(in_register_00000034,__fd);
  if (*(char *)(*(long *)(pPVar5->bytes + 0x20) + 0x28) == '\x01') {
    kj::Exception::Exception(&local_1b8,(Exception *)(*(long *)(pPVar5->bytes + 0x20) + 0x30));
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
              ((PromiseDisposer *)&local_1c0,&local_1b8);
    pp_Var3 = local_1c0;
    local_1c0 = (_func_int **)0x0;
    (this->super_Connection).super_Connection._vptr_Connection = pp_Var3;
    kj::Exception::~Exception(&local_1b8);
  }
  else if ((*(long *)(pPVar5->bytes + 0xb0) == 0) ||
          (*(char *)(*(long *)(pPVar5->bytes + 0xb0) + 0x2e1) == '\x01')) {
    kj::_::readyNow();
    (this->super_Connection).super_Connection._vptr_Connection =
         (_func_int **)local_1b8.ownFile.content.ptr;
  }
  else {
    kj::yield();
    OVar2.ptr = local_1d0.ptr;
    pPVar1 = ((local_1d0.ptr)->super_PromiseArenaMember).arena;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_1d0.ptr - (long)pPVar1) < 0x28) {
      pvVar4 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_1d0,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:461:30)>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_006e5070;
      *(PromiseArena **)((long)pvVar4 + 0x3f8) = pPVar5;
      *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
    }
    else {
      ((local_1d0.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)&local_1d0.ptr[-3].super_PromiseArenaMember.arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_1d0,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:461:30)>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_006e5070;
      OVar2.ptr[-1].super_PromiseArenaMember.arena = pPVar5;
      OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
    }
    local_1b8.ownFile.content.ptr =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
    ;
    local_1b8.ownFile.content.size_ = (size_t)&DAT_0050541c;
    local_1b8.ownFile.content.disposer = (ArrayDisposer *)0x4c0000058b;
    local_1c8.ptr = &this_00->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_1c0,&local_1c8,(SourceLocation *)&local_1b8);
    OVar2.ptr = local_1c8.ptr;
    (this->super_Connection).super_Connection._vptr_Connection = local_1c0;
    if ((TransformPromiseNodeBase *)local_1c8.ptr != (TransformPromiseNodeBase *)0x0) {
      local_1c8.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    }
    OVar2.ptr = local_1d0.ptr;
    if (&(local_1d0.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_1d0.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    }
  }
  return (int)this;
}

Assistant:

kj::Promise<void> shutdown() override {
      KJ_IF_SOME(e, vat.shutdownExceptionToThrow) {
        return kj::cp(e);
      }
      KJ_IF_SOME(p, partner) {
        if (p.initiatedIdleShutdown) {
          // Partner already initiated shutdown so don't wait for it to call
          // receiveIncomingMessage() again (it won't).
          return kj::READY_NOW;
        }

        // Make sure partner receives EOF. We have to evalLater() because
        // OutgoingMessageImpl::send() also does that and we need to deliver in order.
        return kj::evalLater([this]() -> kj::Promise<void> {
          KJ_IF_SOME(p, partner) {
            p.messageQueue.push(kj::none);
            auto paf = kj::newPromiseAndFulfiller<void>();
            p.fulfillOnEnd = kj::mv(paf.fulfiller);
            return kj::mv(paf.promise);
          } else {
            return kj::READY_NOW;
          }
        });
      } else {
        return kj::READY_NOW;
      }
    }